

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void math::wide_integer::uintwide_t<131072u,unsigned_int,std::allocator<void>,false>::
     eval_multiply_kara_n_by_n_to_2n<unsigned_int*,unsigned_int_const*,unsigned_int_const*,unsigned_int*>
               (uint *r,uint *a,uint *b,unsigned_fast_type n,uint *t)

{
  uint *r_00;
  uint *r_01;
  uint *t_00;
  uint *v;
  uint *b_00;
  int_fast8_t iVar1;
  int_fast8_t iVar2;
  bool has_borrow;
  limb_type lVar3;
  long lVar4;
  ulong n_00;
  uint *a_00;
  
  if (n < 0x31) {
    eval_multiply_n_by_n_to_2n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(r,a,b,n);
    return;
  }
  n_00 = n >> 1;
  a_00 = a + n_00;
  b_00 = b + n_00;
  r_00 = r + n_00;
  r_01 = t + n_00;
  eval_multiply_kara_n_by_n_to_2n<unsigned_int*,unsigned_int_const*,unsigned_int_const*,unsigned_int*>
            (r + n,a_00,b_00,n_00,t);
  eval_multiply_kara_n_by_n_to_2n<unsigned_int*,unsigned_int_const*,unsigned_int_const*,unsigned_int*>
            (r,a,b,n_00,t);
  for (lVar4 = 0; n * 8 - lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined4 *)((long)t + lVar4) = *(undefined4 *)((long)r + lVar4);
  }
  t_00 = r_00 + n;
  v = t + n;
  lVar3 = eval_add_n<unsigned_int*,unsigned_int*,unsigned_int*>(r_00,r_00,v,n,0);
  eval_multiply_kara_propagate_carry<unsigned_int*>(t_00,n_00,lVar3);
  lVar3 = eval_add_n<unsigned_int*,unsigned_int*,unsigned_int*>(r_00,r_00,t,n,0);
  eval_multiply_kara_propagate_carry<unsigned_int*>(t_00,n_00,lVar3);
  iVar1 = compare_ranges<unsigned_int_const*,unsigned_int_const*>(a_00,a,n_00);
  if (iVar1 == -1) {
    eval_subtract_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(t,a,a_00,n_00,false);
  }
  else if (iVar1 == '\x01') {
    eval_subtract_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(t,a_00,a,n_00,false);
  }
  iVar2 = compare_ranges<unsigned_int_const*,unsigned_int_const*>(b,b_00,n_00);
  if (iVar2 == -1) {
    eval_subtract_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(r_01,b_00,b,n_00,false);
  }
  else if (iVar2 == '\x01') {
    eval_subtract_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(r_01,b,b_00,n_00,false);
  }
  eval_multiply_kara_n_by_n_to_2n<unsigned_int*,unsigned_int*,unsigned_int*,unsigned_int*>
            (v,t,r_01,n_00,t + n * 2);
  if ((int_fast8_t)(iVar2 * iVar1) != -1) {
    if ((int_fast8_t)(iVar2 * iVar1) == '\x01') {
      lVar3 = eval_add_n<unsigned_int*,unsigned_int*,unsigned_int*>(r_00,r_00,v,n,0);
      eval_multiply_kara_propagate_carry<unsigned_int*>(t_00,n_00,lVar3);
      return;
    }
    return;
  }
  has_borrow = eval_subtract_n<unsigned_int*,unsigned_int*,unsigned_int*>(r_00,r_00,v,n,false);
  eval_multiply_kara_propagate_borrow<unsigned_int*>(t_00,n_00,has_borrow);
  return;
}

Assistant:

static constexpr
    auto eval_multiply_kara_n_by_n_to_2n(      ResultIterator     r, // NOLINT(misc-no-recursion)
                                         const InputIteratorLeft  a,
                                         const InputIteratorRight b,
                                         const unsigned_fast_type n,
                                               InputIteratorTemp  t) -> void
    {
      if(n <= static_cast<unsigned_fast_type>(UINT32_C(48)))
      {
        static_cast<void>(t);

        eval_multiply_n_by_n_to_2n(r, a, b, n);
      }
      else
      {
        static_assert
        (
             (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type>::digits)
          && (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorRight>::value_type>::digits)
          && (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorTemp>::value_type>::digits),
          "Error: Internals require same widths for left-right-result limb_types at the moment"
        );

        using local_limb_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type;

        using result_difference_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::difference_type;
        using left_difference_type   = typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::difference_type;
        using right_difference_type  = typename detail::iterator_detail::iterator_traits<InputIteratorRight>::difference_type;
        using temp_difference_type   = typename detail::iterator_detail::iterator_traits<InputIteratorTemp>::difference_type;

        // Based on "Algorithm 1.3 KaratsubaMultiply", Sect. 1.3.2, page 5
        // of R.P. Brent and P. Zimmermann, "Modern Computer Arithmetic",
        // Cambridge University Press (2011).

        // The Karatsuba multipliation computes the product of u*v as:
        // [b^N + b^(N/2)] a1*b1 + [b^(N/2)](a1 - a0)(b0 - b1) + [b^(N/2) + 1] a0*b0

        // Here we visualize u and v in two components 0,1 corresponding
        // to the high and low order parts, respectively.

        // Step 1
        // Calculate a1*b1 and store it in the upper part of r.
        // Calculate a0*b0 and store it in the lower part of r.
        // copy r to t0.

        // Step 2
        // Add a1*b1 (which is t2) to the middle two-quarters of r (which is r1)
        // Add a0*b0 (which is t0) to the middle two-quarters of r (which is r1)

        // Step 3
        // Calculate |a1-a0| in t0 and note the sign (i.e., the borrow flag)

        // Step 4
        // Calculate |b0-b1| in t1 and note the sign (i.e., the borrow flag)

        // Step 5
        // Call kara mul to calculate |a1-a0|*|b0-b1| in (t2),
        // while using temporary storage in t4 along the way.

        // Step 6
        // Check the borrow signs. If a1-a0 and b0-b1 have the same signs,
        // then add |a1-a0|*|b0-b1| to r1, otherwise subtract it from r1.

        const auto nh = static_cast<unsigned_fast_type>(n / 2U);

        const InputIteratorLeft   a0 = detail::advance_and_point(a, static_cast<left_difference_type>(0));
        const InputIteratorLeft   a1 = detail::advance_and_point(a, static_cast<left_difference_type>(nh));

        const InputIteratorRight  b0 = detail::advance_and_point(b, static_cast<right_difference_type>(0));
        const InputIteratorRight  b1 = detail::advance_and_point(b, static_cast<right_difference_type>(nh));

              ResultIterator      r0 = detail::advance_and_point(r, static_cast<result_difference_type>(0));
              ResultIterator      r1 = detail::advance_and_point(r, static_cast<result_difference_type>(nh));
              ResultIterator      r2 = detail::advance_and_point(r, static_cast<result_difference_type>(n));
              ResultIterator      r3 = detail::advance_and_point(r, static_cast<result_difference_type>(static_cast<result_difference_type>(n) + static_cast<result_difference_type>(nh)));

              InputIteratorTemp   t0 = detail::advance_and_point(t, static_cast<temp_difference_type>(0));
              InputIteratorTemp   t1 = detail::advance_and_point(t, static_cast<temp_difference_type>(nh));
              InputIteratorTemp   t2 = detail::advance_and_point(t, static_cast<temp_difference_type>(n));
              InputIteratorTemp   t4 = detail::advance_and_point(t, static_cast<temp_difference_type>(static_cast<result_difference_type>(n) + static_cast<result_difference_type>(n)));

        // Step 1
        //   a1*b1 -> r2
        //   a0*b0 -> r0
        //   r -> t0
        eval_multiply_kara_n_by_n_to_2n(r2, a1, b1, nh, t0);
        eval_multiply_kara_n_by_n_to_2n(r0, a0, b0, nh, t0);
        detail::copy_unsafe(r0, detail::advance_and_point(r0, static_cast<result_difference_type>(static_cast<result_difference_type>(n) * static_cast<result_difference_type>(2U))), t0);

        // Step 2
        //   r1 += a1*b1
        //   r1 += a0*b0
        auto carry = static_cast<local_limb_type>(eval_add_n(r1, r1, t2, n));
        eval_multiply_kara_propagate_carry(r3, nh, carry);
        carry = static_cast<local_limb_type>(eval_add_n(r1, r1, t0, n));
        eval_multiply_kara_propagate_carry(r3, nh, carry);

        // Step 3
        //   |a1-a0| -> t0
        const auto cmp_result_a1a0 = compare_ranges(a1, a0, nh);

        if(cmp_result_a1a0 == static_cast<std::int_fast8_t>(INT8_C(1)))
        {
          static_cast<void>(eval_subtract_n(t0, a1, a0, nh));
        }
        else if(cmp_result_a1a0 == static_cast<std::int_fast8_t>(INT8_C(-1)))
        {
          static_cast<void>(eval_subtract_n(t0, a0, a1, nh));
        }

        // Step 4
        //   |b0-b1| -> t1
        const auto cmp_result_b0b1 = compare_ranges(b0, b1, nh);

        if(cmp_result_b0b1 == static_cast<std::int_fast8_t>(INT8_C(1)))
        {
          static_cast<void>(eval_subtract_n(t1, b0, b1, nh));
        }
        else if(cmp_result_b0b1 == static_cast<std::int_fast8_t>(INT8_C(-1)))
        {
          static_cast<void>(eval_subtract_n(t1, b1, b0, nh));
        }

        // Step 5
        //   |a1-a0|*|b0-b1| -> t2
        eval_multiply_kara_n_by_n_to_2n(t2, t0, t1, nh, t4);

        // Step 6
        //   either r1 += |a1-a0|*|b0-b1|
        //   or     r1 -= |a1-a0|*|b0-b1|
        if(static_cast<std::int_fast8_t>(cmp_result_a1a0 * cmp_result_b0b1) == static_cast<std::int_fast8_t>(INT8_C(1)))
        {
          carry = eval_add_n(r1, r1, t2, n);

          eval_multiply_kara_propagate_carry(r3, nh, carry);
        }
        else if(static_cast<std::int_fast8_t>(cmp_result_a1a0 * cmp_result_b0b1) == static_cast<std::int_fast8_t>(INT8_C(-1)))
        {
          const auto has_borrow = eval_subtract_n(r1, r1, t2, n);

          eval_multiply_kara_propagate_borrow(r3, nh, has_borrow);
        }
      }
    }